

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O0

int cfg_validate_bitmap256(autobuf *out,char *section_name,char *entry_name,char *value)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  char *local_40;
  char *end;
  char *pcStack_30;
  int num;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  autobuf *out_local;
  
  pcStack_30 = value;
  value_local = entry_name;
  entry_name_local = section_name;
  section_name_local = (char *)out;
  iVar1 = strcasecmp(value,"all");
  if ((iVar1 == 0) || (iVar1 = strcasecmp(pcStack_30,"none"), iVar1 == 0)) {
    return 0;
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = strtol(pcStack_30,&local_40,10);
  end._4_4_ = (int)lVar3;
  piVar2 = __errno_location();
  if ((*piVar2 == 0) && (((*local_40 == '\0' && (-0x100 < end._4_4_)) && (end._4_4_ < 0x100)))) {
    return 0;
  }
  cfg_append_printable_line
            ((autobuf *)section_name_local,
             "Value \'%s\' for entry \'%s\' in section %s must be a \'all\', \'none\' or a number between 0 and 255 (with optional \'-\' in front of the number)"
             ,pcStack_30,value_local,entry_name_local);
  return -1;
}

Assistant:

int
cfg_validate_bitmap256(struct autobuf *out, const char *section_name, const char *entry_name, const char *value) {
  int num;
  char *end;

  if (strcasecmp(value, "all") == 0 || strcasecmp(value, "none") == 0) {
    return 0;
  }

  errno = 0;
  num = strtol(value, &end, 10);
  if (errno != 0 || *end != 0 || num < -255 || num > 255) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s must be a '" BITMAP256_ALL "', '" BITMAP256_NONE "' or a number between 0 and 255"
      " (with optional '-' in front of the number)",
      value, entry_name, section_name);
    return -1;
  }
  return 0;
}